

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::LoopConstraint::calcConstraintForces
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *LagMultSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  double *pdVar1;
  ConstraintCache *pCVar2;
  double dVar3;
  pointer puVar4;
  pointer pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  ConstraintCache *pCVar16;
  ActualDstType actualDst;
  long lVar17;
  PointerType ptr;
  bool update_kinematics;
  ulong uVar18;
  pointer pSVar19;
  Packet2d mask_2;
  assign_op<double,_double> local_131;
  ConstraintCache *local_130;
  uint local_124;
  ConstraintCache *local_120;
  Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> local_118;
  undefined1 local_d8 [56];
  double dStack_a0;
  double local_98;
  ConstraintCache *local_90;
  undefined8 local_88;
  undefined8 local_80;
  ConstraintCache *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined1 *local_58;
  ConstraintCache *local_50;
  undefined8 local_40;
  
  local_130 = (ConstraintCache *)Q;
  local_120 = (ConstraintCache *)LagMultSys;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(constraintBodiesUpd,2);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize(&constraintBodyFramesUpd->
            super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ,2);
  pCVar2 = local_130;
  local_124 = (uint)updateKinematics;
  CalcBodyToBaseCoordinates
            ((Vector3d *)local_d8,model,(VectorNd *)local_130,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(undefined8 *)(cache + 0x4c8) = local_d8._16_8_;
  *(undefined8 *)(cache + 0x4b8) = local_d8._0_8_;
  *(undefined8 *)(cache + 0x4c0) = local_d8._8_8_;
  update_kinematics = SUB41(local_124,0);
  CalcBodyWorldOrientation
            ((Matrix3d *)local_d8,model,(VectorNd *)pCVar2,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,update_kinematics);
  local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.m_value
       = (long)(this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_d8;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x470),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_118);
  CalcBodyToBaseCoordinates
            ((Vector3d *)local_d8,model,(VectorNd *)local_130,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,update_kinematics);
  *(undefined8 *)(cache + 0x528) = local_d8._16_8_;
  *(undefined8 *)(cache + 0x518) = local_d8._0_8_;
  *(undefined8 *)(cache + 0x520) = local_d8._8_8_;
  CalcBodyWorldOrientation
            ((Matrix3d *)local_d8,model,(VectorNd *)local_130,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],SUB41(local_124,0));
  local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.m_value
       = (long)((this->super_Constraint).bodyFrames.
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_d8;
  local_130 = cache + 0x4d0;
  Matrix3_t::operator=
            ((Matrix3_t *)(cache + 0x4d0),
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_118);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            (&constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,2);
  pSVar19 = (constraintForcesUpd->
            super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(double *)
   ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = 0.0;
  *(double *)
   ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
  *(double *)
   ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = 0.0;
  *(undefined8 *)
   &(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(undefined8 *)(cache + 0x3a0) = 0;
  *(undefined8 *)(cache + 0x3a8) = 0;
  *(undefined8 *)(cache + 0x390) = 0;
  *(undefined8 *)(cache + 0x398) = 0;
  *(undefined8 *)(cache + 0x380) = 0;
  *(undefined8 *)(cache + 0x388) = 0;
  if ((this->super_Constraint).sizeOfConstraint != 0) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      Math::SpatialTransform::apply
                ((SpatialTransform *)(cache + 0x470),
                 (SpatialVector *)(*(long *)&(this->super_Constraint).field_0xd8 + lVar17));
      *(undefined8 *)(cache + 0x370) = local_d8._32_8_;
      *(undefined8 *)(cache + 0x378) = local_d8._40_8_;
      *(undefined8 *)(cache + 0x360) = local_d8._16_8_;
      *(undefined8 *)(cache + 0x368) = local_d8._24_8_;
      *(undefined8 *)(cache + 0x350) = local_d8._0_8_;
      *(undefined8 *)(cache + 0x358) = local_d8._8_8_;
      dVar3 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_120->field_0x0)->
              m_storage).m_data[(this->super_Constraint).rowInSystem + (int)uVar18];
      dVar10 = *(double *)(cache + 0x358) * dVar3 + *(double *)(cache + 0x388);
      auVar7._8_4_ = SUB84(dVar10,0);
      auVar7._0_8_ = *(double *)(cache + 0x350) * dVar3 + *(double *)(cache + 0x380);
      auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x380) = auVar7;
      dVar10 = *(double *)(cache + 0x368) * dVar3 + *(double *)(cache + 0x398);
      auVar8._8_4_ = SUB84(dVar10,0);
      auVar8._0_8_ = *(double *)(cache + 0x360) * dVar3 + *(double *)(cache + 0x390);
      auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x390) = auVar8;
      dVar10 = dVar3 * *(double *)(cache + 0x378) + *(double *)(cache + 0x3a8);
      auVar6._8_4_ = SUB84(dVar10,0);
      auVar6._0_8_ = dVar3 * *(double *)(cache + 0x370) + *(double *)(cache + 0x3a0);
      auVar6._12_4_ = (int)((ulong)dVar10 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x3a0) = auVar6;
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x30;
    } while (uVar18 < (this->super_Constraint).sizeOfConstraint);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(constraintBodiesUpd,2);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize(&constraintBodyFramesUpd->
            super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ,2);
  if (resolveAllInRootFrame) {
    puVar4 = (constraintBodiesUpd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar4[0] = 0;
    puVar4[1] = 0;
    pSVar5 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar3 = *(double *)(cache + 0x4c0);
    *(undefined8 *)
     &(pSVar5->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
         *(undefined8 *)(cache + 0x4b8);
    *(double *)((long)&(pSVar5->r).super_Vector3d + 8) = dVar3;
    *(double *)((long)&(pSVar5->r).super_Vector3d + 0x10) = *(double *)(cache + 0x4c8);
    pSVar5 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar3 = *(double *)(cache + 0x520);
    *(undefined8 *)
     &pSVar5[1].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
         *(undefined8 *)(cache + 0x518);
    *(double *)((long)&pSVar5[1].r.super_Vector3d + 8) = dVar3;
    *(double *)((long)&pSVar5[1].r.super_Vector3d + 0x10) = *(double *)(cache + 0x528);
    pSVar19 = (constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = *(uint *)(cache + 900);
    uVar12 = *(undefined8 *)(cache + 0x388);
    *(undefined4 *)
     &(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = *(undefined4 *)(cache + 0x380);
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 4) =
         uVar15 ^ 0x80000000;
    *(int *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = (int)uVar12;
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0xc) =
         (uint)((ulong)uVar12 >> 0x20) ^ 0x80000000;
    uVar15 = *(uint *)(cache + 0x394);
    uVar12 = *(undefined8 *)(cache + 0x398);
    *(undefined4 *)
     ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
         *(undefined4 *)(cache + 0x390);
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x14) =
         uVar15 ^ 0x80000000;
    *(int *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) =
         (int)uVar12;
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x1c) =
         (uint)((ulong)uVar12 >> 0x20) ^ 0x80000000;
    uVar15 = *(uint *)(cache + 0x3a4);
    uVar12 = *(undefined8 *)(cache + 0x3a8);
    *(undefined4 *)
     ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
         *(undefined4 *)(cache + 0x3a0);
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x24) =
         uVar15 ^ 0x80000000;
    *(int *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
         (int)uVar12;
    *(uint *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x2c) =
         (uint)((ulong)uVar12 >> 0x20) ^ 0x80000000;
    pSVar19 = (constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar3 = *(double *)(cache + 0x388);
    *(undefined8 *)
     &pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = *(undefined8 *)(cache + 0x380);
    *(double *)
     ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar3;
    dVar3 = *(double *)(cache + 0x398);
    *(double *)
     ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
         *(double *)(cache + 0x390);
    *(double *)
     ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = dVar3;
    dVar3 = *(double *)(cache + 0x3a8);
    *(double *)
     ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
         *(double *)(cache + 0x3a0);
    *(double *)
     ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = dVar3;
  }
  else {
    pCVar2 = cache + 0x380;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (constraintBodiesUpd,&(this->super_Constraint).bodyIds);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator=(&constraintBodyFramesUpd->
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ,&(this->super_Constraint).bodyFrames.
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               );
    pSVar19 = (constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)0x1;
    local_d8._0_8_ = -*(double *)(cache + 0x470);
    local_d8._8_8_ = -*(double *)(cache + 0x478);
    local_d8._16_8_ = -*(double *)(cache + 0x480);
    local_d8._24_8_ = -*(double *)(cache + 0x488);
    local_d8._32_8_ = -*(double *)(cache + 0x490);
    local_d8._40_8_ = -*(double *)(cache + 0x498);
    dVar10 = -*(double *)(cache + 0x4a8);
    unique0x10000430 = SUB84(*(double *)(cache + 0x4a8),0);
    local_d8._48_8_ = -*(double *)(cache + 0x4a0);
    unique0x10000434 = (int)((ulong)dVar10 >> 0x20);
    local_98 = -*(double *)(cache + 0x4b0);
    local_88 = 3;
    local_80 = 1;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 6;
    local_40 = 3;
    dVar13 = *(double *)(cache + 0x380);
    dVar14 = *(double *)(cache + 0x388);
    dVar3 = *(double *)(cache + 0x390);
    dVar9 = dVar3 * (double)local_d8._16_8_ +
            (double)local_d8._8_8_ * dVar14 + (double)local_d8._0_8_ * dVar13;
    dVar11 = dVar3 * (double)local_d8._40_8_ +
             (double)local_d8._32_8_ * dVar14 + (double)local_d8._24_8_ * dVar13;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value._0_4_ = SUB84(dVar11,0);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)dVar9;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value._4_4_ = (int)((ulong)dVar11 >> 0x20);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)((dVar10 * dVar14 + -*(double *)(cache + 0x4a0) * dVar13) -
                    *(double *)(cache + 0x4b0) * dVar3);
    local_78 = pCVar2;
    local_58 = local_d8;
    if (((ulong)pSVar19 & 7) == 0) {
      uVar18 = (ulong)(((uint)((ulong)pSVar19 >> 3) & 1) * 8);
      local_90 = pCVar2;
      local_50 = pCVar2;
      if (((ulong)pSVar19 >> 3 & 1) == 0) {
        memcpy((void *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + uVar18
                       ),
               (void *)((long)&local_118.
                               super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                               .m_data + uVar18),0x10);
        *(long *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
             local_118.
             super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
             m_cols.m_value;
      }
      else {
        *(double *)
         &(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = dVar9;
        memcpy((void *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + uVar18
                       ),
               (void *)((long)&local_118.
                               super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                               .m_data + uVar18),0x10);
      }
      pSVar19 = (constraintForcesUpd->
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *(long *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
           local_118.
           super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
           m_cols.m_value;
      *(double *)
       &(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = dVar9;
      *(long *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           local_118.
           super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
           m_rows.m_value;
    }
    local_120 = cache + 0x398;
    pdVar1 = (double *)
             ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)0x1;
    local_d8._0_8_ = -*(double *)(cache + 0x470);
    local_d8._8_8_ = -*(double *)(cache + 0x478);
    local_d8._16_8_ = -*(double *)(cache + 0x480);
    local_d8._24_8_ = -*(double *)(cache + 0x488);
    local_d8._32_8_ = -*(double *)(cache + 0x490);
    local_d8._40_8_ = -*(double *)(cache + 0x498);
    local_d8._48_8_ = -*(double *)(cache + 0x4a0);
    dStack_a0 = -*(double *)(cache + 0x4a8);
    local_98 = -*(double *)(cache + 0x4b0);
    local_88 = 3;
    local_80 = 1;
    local_70 = 3;
    uStack_68 = 0;
    local_60 = 6;
    local_40 = 3;
    dVar11 = *(double *)(cache + 0x398);
    dVar13 = *(double *)(cache + 0x3a0);
    dVar3 = *(double *)(cache + 0x3a8);
    dVar10 = dVar3 * (double)local_d8._16_8_ +
             (double)local_d8._8_8_ * dVar13 + (double)local_d8._0_8_ * dVar11;
    dVar9 = dVar3 * (double)local_d8._40_8_ +
            (double)local_d8._32_8_ * dVar13 + (double)local_d8._24_8_ * dVar11;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value._0_4_ = SUB84(dVar9,0);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)dVar10;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value._4_4_ = (int)((ulong)dVar9 >> 0x20);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = (long)((dStack_a0 * dVar13 + (double)local_d8._48_8_ * dVar11) -
                    *(double *)(cache + 0x4b0) * dVar3);
    local_90 = local_120;
    local_50 = local_120;
    if (((ulong)pdVar1 & 7) == 0) {
      uVar18 = (ulong)(((uint)((ulong)pdVar1 >> 3) & 1) * 8);
      if (((ulong)pdVar1 >> 3 & 1) == 0) {
        local_78 = pCVar2;
        local_58 = local_d8;
        memcpy((void *)((long)pdVar1 + uVar18),
               (void *)((long)&local_118.
                               super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                               .m_data + uVar18),0x10);
        *(long *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
             local_118.
             super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
             m_cols.m_value;
      }
      else {
        *pdVar1 = dVar10;
        local_78 = pCVar2;
        local_58 = local_d8;
        memcpy((void *)((long)pdVar1 + uVar18),
               (void *)((long)&local_118.
                               super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                               .m_data + uVar18),0x10);
      }
      pSVar19 = (constraintForcesUpd->
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *(long *)((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
           local_118.
           super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
           m_cols.m_value;
      *pdVar1 = dVar10;
      *(double *)
       ((long)&(pSVar19->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
           local_118.
           super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.
           m_rows.m_value;
      local_78 = pCVar2;
      local_58 = local_d8;
    }
    pCVar16 = local_130;
    local_d8._0_8_ = local_130;
    local_d8._16_8_ = 1.48219693752374e-323;
    local_d8._24_8_ = 4.94065645841247e-324;
    local_d8._40_8_ = 0.0;
    local_d8._48_8_ = 0.0;
    dStack_a0 = 2.96439387504748e-323;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         &pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 0;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_d8._8_8_ = pCVar2;
    local_d8._32_8_ = pCVar2;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)
         local_118.
         super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
              (&local_118,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_d8,&local_131,(type)0x0);
    local_d8._0_8_ = pCVar16;
    local_d8._8_8_ = local_120;
    local_d8._16_8_ = 1.48219693752374e-323;
    local_d8._24_8_ = 4.94065645841247e-324;
    local_d8._40_8_ = 1.48219693752374e-323;
    stack0xffffffffffffff58 = ZEXT816(6) << 0x40;
    pSVar19 = (constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         &pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (double *)
         ((long)&pSVar19[1].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_d8._32_8_ = pCVar2;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
              (&local_118,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_d8,&local_131,(type)0x0);
  }
  return;
}

Assistant:

void LoopConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagMultSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{
  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;

  constraintForcesUpd.resize(2);
  constraintForcesUpd[0].setZero();
  constraintForcesUpd[1].setZero();


  //Using Eqn. 8.30 of Featherstone. Note that this force is resolved in the
  //root frame.
  cache.svecB.setZero();
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    cache.svecA =  cache.stA.apply(T[i]);
    cache.svecB += cache.svecA*LagMultSys[rowInSystem+i];
  }

  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = 0;
    constraintBodiesUpd[1] = 0;

    //These forces are returned in the coordinates of the
    //root frame but w.r.t. the respective points of the constaint
    constraintBodyFramesUpd[0].r = cache.stA.r;
    constraintBodyFramesUpd[0].E.Identity();

    constraintBodyFramesUpd[1].r = cache.stB.r;
    constraintBodyFramesUpd[1].E.Identity();

    //The forces applied to the successor body are equal and opposite
    constraintForcesUpd[0] = -cache.svecB;
    constraintForcesUpd[1] = cache.svecB;

  }else{

    constraintBodiesUpd     = bodyIds;
    constraintBodyFramesUpd = bodyFrames;

    constraintForcesUpd[0].block(0,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[0].block(3,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(3,0,3,1);


    constraintForcesUpd[1].block(0,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[1].block(3,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(3,0,3,1);



  }



}